

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

_Bool import_encrypted(Filename *filename,int type,char **comment)

{
  _Bool _Var1;
  LoadedFile *lf;
  
  lf = lf_load_keyfile(filename,(char **)0x0);
  if (lf == (LoadedFile *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = import_encrypted_s(filename,lf->binarysource_,type,comment);
    lf_free(lf);
  }
  return _Var1;
}

Assistant:

bool import_encrypted(const Filename *filename, int type, char **comment)
{
    LoadedFile *lf = lf_load_keyfile(filename, NULL);
    if (!lf)
        return false; /* couldn't even open the file */

    bool toret = import_encrypted_s(filename, BinarySource_UPCAST(lf),
                                    type, comment);
    lf_free(lf);
    return toret;
}